

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitutils.h
# Opt level: O2

unsigned_long
spvtools::utils::ClearHighBits<unsigned_long>(unsigned_long word,size_t num_bits_to_set)

{
  unsigned_long uVar1;
  
  if (num_bits_to_set == 0) {
    return word;
  }
  if (num_bits_to_set < 0x41) {
    uVar1 = MutateBits<unsigned_long>(word,0x40 - num_bits_to_set,num_bits_to_set,false);
    return uVar1;
  }
  __assert_fail("num_bits_to_set <= word_bit_width && \"Can\'t clear more bits than bit width\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/bitutils.h"
                ,0xb3,"T spvtools::utils::ClearHighBits(T, size_t) [T = unsigned long]");
}

Assistant:

T ClearHighBits(T word, size_t num_bits_to_set) {
  if (num_bits_to_set == 0) {
    return word;
  }
  const size_t word_bit_width = IntegerBitWidth<T>::get;
  assert(num_bits_to_set <= word_bit_width &&
         "Can't clear more bits than bit width");
  return MutateBits(word, word_bit_width - num_bits_to_set, num_bits_to_set,
                    false);
}